

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void testDeepScanLineBasic(string *tempDir)

{
  int iVar1;
  Compression *pCVar2;
  Header h;
  Header HStack_58;
  V2f local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  random_reseed(1);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  local_20.x = 0.0;
  local_20.y = 0.0;
  Imf_2_5::Header::Header(&HStack_58,0x40,0x40,1.0,&local_20,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_2_5::Header::setType(&HStack_58,(string *)Imf_2_5::DEEPTILE_abi_cxx11_);
  pCVar2 = Imf_2_5::Header::compression(&HStack_58);
  *pCVar2 = NO_COMPRESSION;
  Imf_2_5::Header::sanityCheck(&HStack_58,false,false);
  pCVar2 = Imf_2_5::Header::compression(&HStack_58);
  *pCVar2 = ZIPS_COMPRESSION;
  Imf_2_5::Header::sanityCheck(&HStack_58,false,false);
  pCVar2 = Imf_2_5::Header::compression(&HStack_58);
  *pCVar2 = RLE_COMPRESSION;
  Imf_2_5::Header::sanityCheck(&HStack_58,false,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"accepted valid compression types\n",0x21);
  pCVar2 = Imf_2_5::Header::compression(&HStack_58);
  *pCVar2 = ZIP_COMPRESSION;
  Imf_2_5::Header::sanityCheck(&HStack_58,false,false);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                ,0x22d,"void (anonymous namespace)::testCompressionTypeChecks()");
}

Assistant:

void testDeepScanLineBasic (const std::string &tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        
        testCompressionTypeChecks();
	
        readWriteTest (tempDir, 1, 100);
	    readWriteTest (tempDir, 3,  50);
        readWriteTest (tempDir,10,  10);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}